

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,TextGenerator *generator)

{
  second_type pFVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Descriptor *type;
  Message *pMVar5;
  undefined4 extraout_var_01;
  MessageLite *this_00;
  second_type *ppFVar6;
  LogMessage *pLVar7;
  AlphaNum *in_R8;
  scoped_ptr<google::protobuf::Message> value_message;
  FieldDescriptor *value_field;
  LogMessage local_178;
  FieldDescriptor *type_url_field;
  string local_138;
  string full_type_name;
  string local_f8;
  string serialized_value;
  DynamicMessageFactory factory;
  AlphaNum local_90;
  AlphaNum local_60;
  long *plVar4;
  
  bVar2 = internal::GetAnyFieldDescriptors(message,&type_url_field,&value_field);
  if (!bVar2) {
    return false;
  }
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  (**(code **)(*plVar4 + 0xc0))(&local_138,plVar4,message,type_url_field);
  full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
  full_type_name._M_string_length = 0;
  full_type_name.field_2._M_local_buf[0] = '\0';
  bVar2 = internal::ParseAnyTypeUrl(&local_138,&full_type_name);
  if (bVar2) {
    iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
    type = DescriptorPool::FindMessageTypeByName
                     (*(DescriptorPool **)(*(long *)(CONCAT44(extraout_var_00,iVar3) + 0x10) + 0x10)
                      ,&full_type_name);
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory(&factory);
      pMVar5 = DynamicMessageFactory::GetPrototype(&factory,type);
      iVar3 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])(pMVar5);
      value_message.ptr_ = (Message *)CONCAT44(extraout_var_01,iVar3);
      (**(code **)(*plVar4 + 0xc0))(&serialized_value,plVar4,message,value_field);
      this_00 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&value_message)->
                 super_MessageLite;
      bVar2 = MessageLite::ParseFromString(this_00,&serialized_value);
      if (bVar2) {
        local_178._0_8_ = "[";
        local_178.filename_ = (char *)0x1;
        local_90.piece_data_ = local_138._M_dataplus._M_p;
        local_90.piece_size_ = local_138._M_string_length;
        local_60.piece_data_ = "]";
        local_60.piece_size_ = 1;
        StrCat_abi_cxx11_(&local_f8,(protobuf *)&local_178,&local_90,&local_60,in_R8);
        TextGenerator::Print(generator,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        local_178._0_8_ = (this->default_field_value_printer_).ptr_;
        ppFVar6 = FindWithDefault<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::TextFormat::FieldValuePrinter_const*,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::TextFormat::FieldValuePrinter_const*>>>>
                            (&this->custom_printers_,&value_field,(second_type *)&local_178);
        pFVar1 = *ppFVar6;
        (*pFVar1->_vptr_FieldValuePrinter[0xd])
                  (&local_178,pFVar1,message,0xffffffffffffffff,0,(ulong)this->single_line_mode_);
        TextGenerator::Print(generator,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        TextGenerator::Indent(generator);
        pMVar5 = internal::scoped_ptr<google::protobuf::Message>::operator*(&value_message);
        Print(this,pMVar5,generator);
        TextGenerator::Outdent(generator);
        (*pFVar1->_vptr_FieldValuePrinter[0xe])
                  (&local_178,pFVar1,message,0xffffffffffffffff,0,(ulong)this->single_line_mode_);
        TextGenerator::Print(generator,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
      }
      else {
        internal::LogMessage::LogMessage
                  (&local_178,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x635);
        pLVar7 = internal::LogMessage::operator<<(&local_178,&local_138);
        pLVar7 = internal::LogMessage::operator<<(pLVar7,": failed to parse contents");
        internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar7);
        internal::LogMessage::~LogMessage(&local_178);
      }
      std::__cxx11::string::~string((string *)&serialized_value);
      if (value_message.ptr_ != (Message *)0x0) {
        (*((value_message.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
      }
      DynamicMessageFactory::~DynamicMessageFactory(&factory);
      goto LAB_00604346;
    }
    internal::LogMessage::LogMessage
              (&local_178,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x62d);
    pLVar7 = internal::LogMessage::operator<<(&local_178,"Proto type ");
    pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_138);
    pLVar7 = internal::LogMessage::operator<<(pLVar7," not found");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar7);
    internal::LogMessage::~LogMessage(&local_178);
  }
  bVar2 = false;
LAB_00604346:
  std::__cxx11::string::~string((string *)&full_type_name);
  std::__cxx11::string::~string((string *)&local_138);
  return bVar2;
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   TextGenerator& generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const string& type_url = reflection->GetString(message, type_url_field);
  string full_type_name;
  if (!internal::ParseAnyTypeUrl(type_url, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const google::protobuf::Descriptor* value_descriptor =
      message.GetDescriptor()->file()->pool()->FindMessageTypeByName(
          full_type_name);
  if (value_descriptor == NULL) {
    GOOGLE_LOG(WARNING) << "Proto type " << type_url << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  google::protobuf::scoped_ptr<google::protobuf::Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    GOOGLE_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator.Print(StrCat("[", type_url, "]"));
  const FieldValuePrinter* printer = FindWithDefault(
      custom_printers_, value_field, default_field_value_printer_.get());
  generator.Print(
      printer->PrintMessageStart(message, -1, 0, single_line_mode_));
  generator.Indent();
  Print(*value_message, generator);
  generator.Outdent();
  generator.Print(printer->PrintMessageEnd(message, -1, 0, single_line_mode_));
  return true;
}